

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::TryFindExtensionInFallbackDatabase
          (DescriptorPool *this,Descriptor *containing_type,int field_number)

{
  DescriptorDatabase *pDVar1;
  uint uVar2;
  string *psVar3;
  Tables *this_00;
  FileDescriptor *pFVar4;
  undefined1 local_100 [8];
  FileDescriptorProto file_proto;
  int field_number_local;
  Descriptor *containing_type_local;
  DescriptorPool *this_local;
  
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    file_proto.source_code_info_._4_4_ = field_number;
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_100);
    pDVar1 = this->fallback_database_;
    psVar3 = Descriptor::full_name_abi_cxx11_(containing_type);
    uVar2 = (*pDVar1->_vptr_DescriptorDatabase[4])
                      (pDVar1,psVar3,(ulong)file_proto.source_code_info_._4_4_,local_100);
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                          (&this->tables_);
      psVar3 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)local_100);
      pFVar4 = Tables::FindFile(this_00,psVar3);
      if (pFVar4 == (FileDescriptor *)0x0) {
        pFVar4 = BuildFileFromDatabase(this,(FileDescriptorProto *)local_100);
        if (pFVar4 == (FileDescriptor *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_100);
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorPool::TryFindExtensionInFallbackDatabase(
    const Descriptor* containing_type, int field_number) const {
  if (fallback_database_ == NULL) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileContainingExtension(
        containing_type->full_name(), field_number, &file_proto)) {
    return false;
  }

  if (tables_->FindFile(file_proto.name()) != NULL) {
    // We've already loaded this file, and it apparently doesn't contain the
    // extension we're looking for.  Some DescriptorDatabases return false
    // positives.
    return false;
  }

  if (BuildFileFromDatabase(file_proto) == NULL) {
    return false;
  }

  return true;
}